

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O2

void aom_highbd_quantize_b_sse2
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  short sVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  short *psVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int coeff_sign [4];
  int abs_coeff [4];
  __m128i zbins [2];
  int local_58 [4];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  uVar5 = (long)((ulong)(uint)((int)count >> 0x1f) << 0x20 | count & 0xffffffffU) / 4;
  uVar9 = uVar5 & 0xffffffff;
  auVar16 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  zbins[0][0]._0_4_ = auVar16._0_4_ >> 0x10;
  zbins[0][0]._4_4_ = auVar16._4_4_ >> 0x10;
  local_58[0] = -(int)zbins[0][0];
  local_58[1] = -zbins[0][0]._4_4_;
  local_58[2] = -zbins[0][0]._4_4_;
  local_58[3] = -zbins[0][0]._4_4_;
  local_48 = -zbins[0][0]._4_4_;
  iStack_44 = -zbins[0][0]._4_4_;
  iStack_40 = -zbins[0][0]._4_4_;
  iStack_3c = -zbins[0][0]._4_4_;
  zbins[0][1]._0_4_ = zbins[0][0]._4_4_;
  zbins[0][1]._4_4_ = zbins[0][0]._4_4_;
  zbins[1][0]._0_4_ = zbins[0][0]._4_4_;
  zbins[1][0]._4_4_ = zbins[0][0]._4_4_;
  zbins[1][1]._0_4_ = zbins[0][0]._4_4_;
  zbins[1][1]._4_4_ = zbins[0][0]._4_4_;
  memset(qcoeff_ptr,0,count * 4);
  memset(dqcoeff_ptr,0,count * 4);
  uVar3 = (uint)uVar5;
  uVar5 = uVar9 * 4;
  uVar7 = uVar9;
  do {
    uVar7 = uVar7 - 1;
    uVar5 = uVar5 - 4;
    uVar11 = (uint)uVar9;
    uVar10 = (int)uVar3 >> 0x1f & uVar3;
    if ((int)uVar11 < 1) break;
    piVar1 = coeff_ptr + (uVar5 & 0xffffffff);
    bVar15 = (int)uVar7 != 0;
    uVar9 = (ulong)bVar15;
    auVar17._0_4_ = -(uint)(*piVar1 < (int)zbins[uVar9][0]);
    auVar17._4_4_ = -(uint)(piVar1[1] < *(int *)((long)zbins[uVar9] + 4));
    auVar17._8_4_ = -(uint)(piVar1[2] < (int)zbins[uVar9][1]);
    auVar17._12_4_ = -(uint)(piVar1[3] < *(int *)((long)zbins[uVar9] + 0xc));
    auVar16._0_4_ = -(uint)(local_58[uVar9 * 4] < *piVar1);
    auVar16._4_4_ = -(uint)(local_58[uVar9 * 4 + 1] < piVar1[1]);
    auVar16._8_4_ = -(uint)(local_58[uVar9 * 4 + 2] < piVar1[2]);
    auVar16._12_4_ = -(uint)(local_58[uVar9 * 4 + 3] < piVar1[3]);
    iVar8 = movmskps((uint)bVar15 << 4,auVar16 & auVar17);
    uVar9 = (ulong)(uVar11 - 1);
    uVar10 = uVar11;
  } while (iVar8 == 0xf);
  uVar7 = 0;
  uVar5 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar5 = uVar7;
  }
  sVar6 = -1;
  for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
    puVar2 = (uint *)(coeff_ptr + uVar9 * 4);
    coeff_sign[0] = (int)*puVar2 >> 0x1f;
    coeff_sign[1] = (int)puVar2[1] >> 0x1f;
    coeff_sign[2] = (int)puVar2[2] >> 0x1f;
    coeff_sign[3] = (int)puVar2[3] >> 0x1f;
    abs_coeff[0] = (*puVar2 ^ coeff_sign[0]) - coeff_sign[0];
    abs_coeff[1] = (puVar2[1] ^ coeff_sign[1]) - coeff_sign[1];
    abs_coeff[2] = (puVar2[2] ^ coeff_sign[2]) - coeff_sign[2];
    abs_coeff[3] = (puVar2[3] ^ coeff_sign[3]) - coeff_sign[3];
    bVar15 = uVar9 != 0;
    auVar18._0_4_ = -(uint)(abs_coeff[0] < (int)zbins[bVar15][0]);
    auVar18._4_4_ = -(uint)(abs_coeff[1] < *(int *)((long)zbins[bVar15] + 4));
    auVar18._8_4_ = -(uint)(abs_coeff[2] < (int)zbins[bVar15][1]);
    auVar18._12_4_ = -(uint)(abs_coeff[3] < *(int *)((long)zbins[bVar15] + 0xc));
    psVar12 = iscan;
    for (uVar13 = 0; uVar13 != 0x10; uVar13 = uVar13 + 4) {
      if ((((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)((byte)(auVar18._12_4_ >> 7) & 1) << 0xc |
                     (ushort)((byte)(auVar18._12_4_ >> 0xf) & 1) << 0xd |
                     (ushort)((byte)(auVar18._12_4_ >> 0x17) & 1) << 0xe |
                    (ushort)(byte)(auVar18._12_4_ >> 0x1f) << 0xf) ^ 0xffff) >>
           ((uint)uVar13 & 0x1f) & 1) != 0) {
        uVar14 = (ulong)((uint)(uVar7 != uVar13) * 2);
        lVar4 = (long)*(short *)((long)round_ptr + uVar14) +
                (long)*(int *)((long)abs_coeff + uVar13);
        uVar3 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar14) *
                       (((ulong)(*(short *)((long)quant_ptr + uVar14) * lVar4) >> 0x10) + lVar4) >>
                      0x10);
        iVar8 = (*(uint *)((long)coeff_sign + uVar13) ^ uVar3) -
                *(uint *)((long)coeff_sign + uVar13);
        *(int *)((long)qcoeff_ptr + uVar13) = iVar8;
        *(int *)((long)dqcoeff_ptr + uVar13) = *(short *)((long)dequant_ptr + uVar14) * iVar8;
        if ((uVar3 != 0) && (sVar6 <= *psVar12)) {
          sVar6 = *psVar12;
        }
      }
      psVar12 = psVar12 + 1;
    }
    iscan = iscan + 4;
    dqcoeff_ptr = dqcoeff_ptr + 4;
    qcoeff_ptr = qcoeff_ptr + 4;
    uVar7 = uVar7 - 0x10;
  }
  *eob_ptr = sVar6 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_sse2(const tran_low_t *coeff_ptr, intptr_t count,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  int i, j, non_zero_regs = (int)count / 4, eob_i = -1;
  __m128i zbins[2];
  __m128i nzbins[2];

  zbins[0] = _mm_set_epi32((int)zbin_ptr[1], (int)zbin_ptr[1], (int)zbin_ptr[1],
                           (int)zbin_ptr[0]);
  zbins[1] = _mm_set1_epi32((int)zbin_ptr[1]);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  (void)scan;

  memset(qcoeff_ptr, 0, count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, count * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = ((int)count / 4) - 1; i >= 0; i--) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (test == 0xffff)
      non_zero_regs--;
    else
      break;
  }

  // Quantization pass:
  for (i = 0; i < non_zero_regs; i++) {
    __m128i coeffs, coeffs_sign, tmp1, tmp2;
    int test;
    int abs_coeff[4];
    int coeff_sign[4];

    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    coeffs_sign = _mm_srai_epi32(coeffs, 31);
    coeffs = _mm_sub_epi32(_mm_xor_si128(coeffs, coeffs_sign), coeffs_sign);
    tmp1 = _mm_cmpgt_epi32(coeffs, zbins[i != 0]);
    tmp2 = _mm_cmpeq_epi32(coeffs, zbins[i != 0]);
    tmp1 = _mm_or_si128(tmp1, tmp2);
    test = _mm_movemask_epi8(tmp1);
    _mm_storeu_si128((__m128i *)abs_coeff, coeffs);
    _mm_storeu_si128((__m128i *)coeff_sign, coeffs_sign);

    for (j = 0; j < 4; j++) {
      if (test & (1 << (4 * j))) {
        int k = 4 * i + j;
        const int64_t tmp3 = abs_coeff[j] + round_ptr[k != 0];
        const int64_t tmp4 = ((tmp3 * quant_ptr[k != 0]) >> 16) + tmp3;
        const uint32_t abs_qcoeff =
            (uint32_t)((tmp4 * quant_shift_ptr[k != 0]) >> 16);
        qcoeff_ptr[k] =
            (int)(abs_qcoeff ^ (uint32_t)coeff_sign[j]) - coeff_sign[j];
        dqcoeff_ptr[k] = qcoeff_ptr[k] * dequant_ptr[k != 0];
        if (abs_qcoeff) eob_i = iscan[k] > eob_i ? iscan[k] : eob_i;
      }
    }
  }
  *eob_ptr = eob_i + 1;
}